

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

int fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  secp256k1_fe local_28;
  
  uVar3 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
  uVar2 = (uVar3 >> 0x34) + a->n[1];
  uVar4 = (uVar2 >> 0x34) + a->n[2];
  uVar5 = (uVar4 >> 0x34) + a->n[3];
  local_28.n[1] = (0x3ffffffffffffc - (uVar2 & 0xfffffffffffff)) + b->n[1];
  local_28.n[2] = (0x3ffffffffffffc - (uVar4 & 0xfffffffffffff)) + b->n[2];
  local_28.n[3] = (0x3ffffffffffffc - (uVar5 & 0xfffffffffffff)) + b->n[3];
  local_28.n[0] = (b->n[0] - (uVar3 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
  local_28.n[4] = (b->n[4] - ((uVar5 >> 0x34) + (a->n[4] & 0xffffffffffff))) + 0x3fffffffffffc;
  iVar1 = secp256k1_fe_impl_normalizes_to_zero(&local_28);
  return iVar1;
}

Assistant:

static int fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe an = *a;
    secp256k1_fe bn = *b;
    secp256k1_fe_normalize_weak(&an);
    return secp256k1_fe_equal(&an, &bn);
}